

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O2

void __thiscall
antlr::BaseAST::doWorkForFindAll
          (BaseAST *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *v,RefAST *target,bool partialMatch)

{
  ASTRef *pAVar1;
  char cVar2;
  AST *pAVar4;
  BaseAST *this_00;
  ASTRefCount<antlr::AST> *pAVar5;
  RefAST sibling;
  ASTRefCount<antlr::AST> local_68;
  ASTRefCount<antlr::AST> local_60;
  ASTRefCount<antlr::AST> local_58;
  ASTRefCount<antlr::AST> local_50;
  uint local_44;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  int iVar3;
  
  local_68.ref = ASTRef::getRef(&this->super_AST);
  local_44 = (uint)partialMatch;
  do {
    pAVar5 = &local_50;
    if ((local_68.ref == (ASTRef *)0x0) || (pAVar4 = (local_68.ref)->ptr, pAVar4 == (AST *)0x0)) {
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_68);
      return;
    }
    pAVar1 = target->ref;
    if (partialMatch) {
      if (pAVar1 != (ASTRef *)0x0) {
        pAVar1->count = pAVar1->count + 1;
      }
      local_50.ref = pAVar1;
      iVar3 = (*pAVar4->_vptr_AST[8])(pAVar4,pAVar5);
      cVar2 = (char)iVar3;
    }
    else {
      if (pAVar1 != (ASTRef *)0x0) {
        pAVar1->count = pAVar1->count + 1;
      }
      pAVar5 = &local_38;
      local_38.ref = pAVar1;
      iVar3 = (*pAVar4->_vptr_AST[7])(pAVar4,pAVar5);
      cVar2 = (char)iVar3;
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(pAVar5);
    if (cVar2 != '\0') {
      std::vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
      ::push_back(v,&local_68);
    }
    (*(local_68.ref)->ptr->_vptr_AST[0xd])(&local_58);
    pAVar5 = &local_58;
    if (local_58.ref == (ASTRef *)0x0) {
LAB_0015e5f8:
      ASTRefCount<antlr::AST>::~ASTRefCount(pAVar5);
    }
    else {
      pAVar4 = (local_58.ref)->ptr;
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_58);
      if (pAVar4 != (AST *)0x0) {
        (*(local_68.ref)->ptr->_vptr_AST[0xd])(&local_60);
        if (local_60.ref == (ASTRef *)0x0) {
          pAVar4 = (AST *)0x0;
        }
        else {
          pAVar4 = (local_60.ref)->ptr;
        }
        ASTRefCount<antlr::BaseAST>::ASTRefCount((ASTRefCount<antlr::BaseAST> *)&local_58,pAVar4);
        if (local_58.ref == (ASTRef *)0x0) {
          this_00 = (BaseAST *)0x0;
        }
        else {
          this_00 = (BaseAST *)(local_58.ref)->ptr;
        }
        local_40.ref = target->ref;
        if (local_40.ref != (ASTRef *)0x0) {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        doWorkForFindAll(this_00,v,&local_40,SUB41(local_44,0));
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
        ASTRefCount<antlr::BaseAST>::~ASTRefCount((ASTRefCount<antlr::BaseAST> *)&local_58);
        pAVar5 = &local_60;
        goto LAB_0015e5f8;
      }
    }
    (*(local_68.ref)->ptr->_vptr_AST[0xe])(&local_58);
    ASTRefCount<antlr::AST>::operator=(&local_68,&local_58);
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_58);
  } while( true );
}

Assistant:

void BaseAST::doWorkForFindAll(
		ANTLR_USE_NAMESPACE(std)vector<RefAST>& v,
		RefAST target,bool partialMatch)
{
	// Start walking sibling lists, looking for matches.
	for (RefAST sibling=this;
			sibling;
			sibling=sibling->getNextSibling())
	{
		if ( (partialMatch && sibling->equalsTreePartial(target)) ||
				(!partialMatch && sibling->equalsTree(target)) ) {
			v.push_back(sibling);
		}
		// regardless of match or not, check any children for matches
		if ( sibling->getFirstChild() ) {
			RefBaseAST(sibling->getFirstChild())->doWorkForFindAll(v, target, partialMatch);
		}
	}
}